

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QStyle * __thiscall QStyleSheetStyle::baseStyle(QStyleSheetStyle *this)

{
  long lVar1;
  QStyle *pQVar2;
  
  pQVar2 = *(QStyle **)(this + 0x10);
  if (pQVar2 == (QStyle *)0x0) {
    QApplication::style();
    lVar1 = QMetaObject::cast((QObject *)&staticMetaObject);
    if (lVar1 == 0) {
      pQVar2 = QApplication::style();
      return pQVar2;
    }
    pQVar2 = *(QStyle **)(lVar1 + 0x10);
  }
  return pQVar2;
}

Assistant:

QStyle *QStyleSheetStyle::baseStyle() const
{
    if (base)
        return base;
    if (QStyleSheetStyle *me = qt_styleSheet(QApplication::style()))
        return me->base;
    return QApplication::style();
}